

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::StreamArchive::write_exported_metadata(StreamArchive *this,void *data_,size_t size)

{
  size_type sVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base _Var3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  __node_base *p_Var7;
  undefined8 *puVar8;
  uint8_t *data;
  size_type *psVar9;
  undefined8 *puVar10;
  uint i;
  
  if (size < 0xb0) {
    return false;
  }
  *(undefined8 *)data_ = 0xb10bf05511153;
  *(size_t *)((long)data_ + 8) = size;
  psVar9 = &this->seen_blobs[0]._M_h._M_element_count;
  sVar5 = 0xb0;
  for (lVar6 = 0x18; lVar6 != 0xb8; lVar6 = lVar6 + 0x10) {
    *(size_t *)((long)data_ + lVar6 + -8) = sVar5;
    sVar1 = *psVar9;
    *(size_type *)((long)data_ + lVar6) = sVar1;
    sVar5 = sVar5 + sVar1 * 0x20;
    psVar9 = psVar9 + 7;
  }
  if (sVar5 == size) {
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      puVar10 = (undefined8 *)(*(long *)((long)data_ + lVar6 * 0x10 + 0x10) + (long)data_);
      p_Var7 = &this->seen_blobs[lVar6]._M_h._M_before_begin;
      puVar8 = puVar10;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
        *puVar8 = p_Var7[1]._M_nxt;
        puVar8[1] = p_Var2;
        _Var3._M_nxt = p_Var7[4]._M_nxt;
        puVar8[2] = p_Var7[3]._M_nxt;
        puVar8[3] = _Var3._M_nxt;
        puVar8 = puVar8 + 4;
      }
      std::
      __sort<Fossilize::ExportedMetadataBlock*,__gnu_cxx::__ops::_Iter_comp_iter<Fossilize::StreamArchive::write_exported_metadata(void*,unsigned_long)const::_lambda(Fossilize::ExportedMetadataBlock_const&,Fossilize::ExportedMetadataBlock_const&)_1_>>
                (puVar10,puVar10 + this->seen_blobs[lVar6]._M_h._M_element_count * 4);
    }
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool write_exported_metadata(void *data_, size_t size) const override
	{
		auto *data = static_cast<uint8_t *>(data_);
		auto *header = static_cast<ExportedMetadataHeader *>(data_);
		if (size < sizeof(*header))
			return false;

		header->magic = ExportedMetadataMagic;
		header->size = size;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			header->lists[i].offset = offset;
			header->lists[i].count = seen_blobs[i].size();
			offset += header->lists[i].count * sizeof(ExportedMetadataBlock);
		}

		if (offset != size)
			return false;

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto *blocks = reinterpret_cast<ExportedMetadataBlock *>(data + header->lists[i].offset);
			auto *pblocks = blocks;

			for (auto &blob : seen_blobs[i])
			{
				auto &block = *pblocks;
				block.hash = blob.first;
				block.file_offset = blob.second.offset;
				block.payload = blob.second.header;
				pblocks++;
			}

			// Sorting here is somewhat important, since we will be using binary search when looking up exported metadata.
			// Conserving memory is also somewhat important, so we should only have one copy of the data structures we need
			// in immutable shared memory.
			// For hashmaps we would either need to make a completely custom SHM compatible hashmap implementation, which
			// would likely consume more memory either way.
			std::sort(blocks, blocks + seen_blobs[i].size(), [](const ExportedMetadataBlock &a, const ExportedMetadataBlock &b) {
				return a.hash < b.hash;
			});
		}

		return true;
	}